

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cube.hpp
# Opt level: O2

void kitty::print_cubes(vector<kitty::cube,_std::allocator<kitty::cube>_> *cubes,uint length,
                       ostream *os)

{
  pointer pcVar1;
  cube *cube;
  pointer this;
  
  pcVar1 = (cubes->super__Vector_base<kitty::cube,_std::allocator<kitty::cube>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (this = (cubes->super__Vector_base<kitty::cube,_std::allocator<kitty::cube>_>)._M_impl.
              super__Vector_impl_data._M_start; this != pcVar1; this = this + 1) {
    kitty::cube::print(this,length,os);
    std::operator<<(os,'\n');
  }
  std::ostream::flush();
  return;
}

Assistant:

inline void print_cubes( const std::vector<cube>& cubes, unsigned length = 32u, std::ostream& os = std::cout )
{
  for ( const auto& cube : cubes )
  {
    cube.print( length, os );
    os << '\n';
  }

  os << std::flush;
}